

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

Box * __thiscall
amrex::CellConservativeQuartic::CoarseBox
          (Box *__return_storage_ptr__,CellConservativeQuartic *this,Box *fine,int ratio)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int local_20 [6];
  
  uVar2 = *(undefined8 *)(fine->smallend).vect;
  uVar3 = *(undefined8 *)((fine->smallend).vect + 2);
  uVar4 = *(undefined8 *)((fine->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(fine->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar2;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar3;
  local_20[3] = ratio;
  local_20[4] = ratio;
  local_20[5] = ratio;
  if (ratio == 1) goto LAB_00557c4d;
  uVar5 = (__return_storage_ptr__->smallend).vect[0];
  if (ratio == 4) {
    (__return_storage_ptr__->smallend).vect[0] = (int)uVar5 >> 2;
    uVar5 = (__return_storage_ptr__->smallend).vect[1];
LAB_00557a75:
    (__return_storage_ptr__->smallend).vect[1] = (int)uVar5 >> 2;
    uVar5 = (__return_storage_ptr__->smallend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = (int)uVar5 >> 2;
    }
    else {
      uVar5 = uVar5 >> 2;
    }
  }
  else if (ratio == 2) {
    (__return_storage_ptr__->smallend).vect[0] = (int)uVar5 >> 1;
    piVar1 = (__return_storage_ptr__->smallend).vect + 1;
    *piVar1 = *piVar1 >> 1;
    uVar5 = (__return_storage_ptr__->smallend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = (int)uVar5 >> 1;
    }
    else {
      uVar5 = uVar5 >> 1;
    }
  }
  else {
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar5;
    uVar5 = (__return_storage_ptr__->smallend).vect[1];
    if (ratio == 4) goto LAB_00557a75;
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
    (__return_storage_ptr__->smallend).vect[1] = uVar5;
    uVar5 = (__return_storage_ptr__->smallend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar5;
  uVar5 = (__return_storage_ptr__->btype).itype;
  if (uVar5 != 0) {
    local_20[0] = 0;
    local_20[1] = 0;
    local_20[2] = 0;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      if (((uVar5 >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
         ((__return_storage_ptr__->bigend).vect[lVar8] % local_20[lVar8 + 3] != 0)) {
        local_20[lVar8] = 1;
      }
    }
    uVar5 = (__return_storage_ptr__->bigend).vect[0];
    if (ratio == 4) {
      uVar5 = (int)uVar5 >> 2;
      uVar7 = (__return_storage_ptr__->bigend).vect[1];
LAB_00557b91:
      uVar7 = (int)uVar7 >> 2;
      (__return_storage_ptr__->bigend).vect[1] = uVar7;
      uVar6 = (__return_storage_ptr__->bigend).vect[2];
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 2;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (ratio == 2) {
      uVar5 = (int)uVar5 >> 1;
      uVar6 = (__return_storage_ptr__->bigend).vect[2];
      uVar7 = (__return_storage_ptr__->bigend).vect[1] >> 1;
      (__return_storage_ptr__->bigend).vect[1] = uVar7;
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 1;
      }
      else {
        uVar6 = uVar6 >> 1;
      }
    }
    else if (ratio == 1) {
      uVar7 = (__return_storage_ptr__->bigend).vect[1];
      uVar6 = (__return_storage_ptr__->bigend).vect[2];
    }
    else {
      if ((int)uVar5 < 0) {
        uVar5 = ~((int)~uVar5 / ratio);
      }
      else {
        uVar5 = (int)uVar5 / ratio;
      }
      uVar7 = (__return_storage_ptr__->bigend).vect[1];
      if (ratio == 4) goto LAB_00557b91;
      if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / ratio);
      }
      else {
        uVar7 = (int)uVar7 / ratio;
      }
      (__return_storage_ptr__->bigend).vect[1] = uVar7;
      uVar6 = (__return_storage_ptr__->bigend).vect[2];
      if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / ratio);
      }
      else {
        uVar6 = (int)uVar6 / ratio;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar5 + local_20[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar7 + local_20[1];
    (__return_storage_ptr__->bigend).vect[2] = uVar6 + local_20[2];
    goto LAB_00557c4d;
  }
  uVar5 = (__return_storage_ptr__->bigend).vect[0];
  if (ratio == 4) {
    (__return_storage_ptr__->bigend).vect[0] = (int)uVar5 >> 2;
    uVar5 = (__return_storage_ptr__->bigend).vect[1];
LAB_00557bce:
    (__return_storage_ptr__->bigend).vect[1] = (int)uVar5 >> 2;
    uVar5 = (__return_storage_ptr__->bigend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = (int)uVar5 >> 2;
    }
    else {
      uVar5 = uVar5 >> 2;
    }
  }
  else if (ratio == 2) {
    (__return_storage_ptr__->bigend).vect[0] = (int)uVar5 >> 1;
    piVar1 = (__return_storage_ptr__->bigend).vect + 1;
    *piVar1 = *piVar1 >> 1;
    uVar5 = (__return_storage_ptr__->bigend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = (int)uVar5 >> 1;
    }
    else {
      uVar5 = uVar5 >> 1;
    }
  }
  else {
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar5;
    uVar5 = (__return_storage_ptr__->bigend).vect[1];
    if (ratio == 4) goto LAB_00557bce;
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar5;
    uVar5 = (__return_storage_ptr__->bigend).vect[2];
    if ((int)uVar5 < 0) {
      uVar5 = ~((int)~uVar5 / ratio);
    }
    else {
      uVar5 = (int)uVar5 / ratio;
    }
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar5;
LAB_00557c4d:
  Box::grow(__return_storage_ptr__,2);
  return __return_storage_ptr__;
}

Assistant:

Box
CellConservativeQuartic::CoarseBox (const Box& fine,
                                    int        ratio)
{
    Box crse(amrex::coarsen(fine,ratio));
    crse.grow(2);
    return crse;
}